

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>
::
Naive_vector_column<std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
          (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,false,true>>>*>>>
           *this,Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
                 *column,Index columnIndex,
          vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  bool bVar1;
  ID_index rowIndex;
  size_type __n;
  Column_support *this_00;
  reference ppEVar2;
  Entry_constructor *local_b0;
  Field_operators *local_a0;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Column_support *__range3;
  Index i;
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>
  local_39;
  value_type local_38;
  Entry_constructor *local_30;
  Column_settings *colSettings_local;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *rowContainer_local;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
  *pNStack_18;
  Index columnIndex_local;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
  *column_local;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
  *this_local;
  
  local_30 = (Entry_constructor *)colSettings;
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local._4_4_ = columnIndex;
  pNStack_18 = column;
  column_local = (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
                  *)this;
  Row_access<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
  ::Row_access((Row_access<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
                *)this,columnIndex,rowContainer);
  Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
              *)(this + 0x10),&pNStack_18->super_Column_dimension_option);
  __n = std::
        vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>
        ::size(&pNStack_18->column_);
  local_38 = (value_type)0x0;
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>
  ::allocator(&local_39);
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>
  ::vector((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>
            *)(this + 0x18),__n,&local_38,&local_39);
  std::
  allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>
  ::~allocator(&local_39);
  if (local_30 == (Entry_constructor *)0x0) {
    local_a0 = pNStack_18->operators_;
  }
  else {
    local_a0 = (Field_operators *)0x0;
  }
  *(Field_operators **)(this + 0x30) = local_a0;
  if (local_30 == (Entry_constructor *)0x0) {
    local_b0 = pNStack_18->entryPool_;
  }
  else {
    local_b0 = local_30;
  }
  *(Entry_constructor **)(this + 0x38) = local_b0;
  __range3._0_4_ = 0;
  this_00 = &pNStack_18->column_;
  __end0 = std::
           vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>
           ::begin(this_00);
  entry = (Entry *)std::
                   vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>
                   ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
                                *)&entry);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
              ::operator*(&__end0);
    rowIndex = Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
               ::get_row_index(*ppEVar2);
    Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
    ::_update_entry((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
                     *)this,rowIndex,(Index)__range3);
    __gnu_cxx::
    __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*const_*,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
    ::operator++(&__end0);
    __range3._0_4_ = (Index)__range3 + 1;
  }
  return;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>::Naive_vector_column(const Naive_vector_column& column,
                                                               Index columnIndex,
                                                               Row_container* rowContainer,
                                                               Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      column_(column.column_.size(), nullptr),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  Index i = 0;
  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _update_entry(entry->get_row_index(), i++);
    } else {
      _update_entry(entry->get_element(), entry->get_row_index(), i++);
    }
  }
}